

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O3

Map_Man_t *
Abc_NtkToMap(Abc_Ntk_t *pNtk,double DelayTarget,int fRecovery,float *pSwitching,int fVerbose)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  Map_Man_t *p;
  char **ppNames;
  Scl_Con_t *pSVar7;
  Abc_Time_t *pAVar8;
  Map_Time_t *pMVar9;
  Map_Node_t *pMVar10;
  Abc_Obj_t *pAVar11;
  Map_Node_t **ppMVar12;
  Vec_Ptr_t *pVVar13;
  long *plVar14;
  ulong uVar15;
  long *plVar16;
  long lVar17;
  int iVar18;
  char *__assertion;
  ulong uVar19;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                  ,0x10d,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
  }
  p = Map_ManCreate((pNtk->vPis->nSize + pNtk->nObjCounts[8]) - pNtk->nBarBufs,
                    (pNtk->nObjCounts[8] - pNtk->nBarBufs) + pNtk->vPos->nSize,fVerbose);
  if (p == (Map_Man_t *)0x0) {
    return (Map_Man_t *)0x0;
  }
  Map_ManSetAreaRecovery(p,fRecovery);
  ppNames = Abc_NtkCollectCioNames(pNtk,1);
  Map_ManSetOutputNames(p,ppNames);
  Map_ManSetDelayTarget(p,(float)DelayTarget);
  iVar18 = 0;
  pSVar7 = Scl_ConReadMan();
  if (pSVar7 == (Scl_Con_t *)0x0) {
LAB_002dbff4:
    pAVar8 = Abc_NtkGetCiArrivalTimes(pNtk);
    pMVar9 = Abc_NtkMapCopyCiArrival(pNtk,pAVar8);
  }
  else {
    pSVar7 = Scl_ConReadMan();
    iVar1 = (pSVar7->vInArrs).nSize;
    if (0 < (long)iVar1) {
      lVar17 = 0;
      iVar18 = 0;
      do {
        iVar18 = iVar18 + (uint)((pSVar7->vInArrs).pArray[lVar17] == 0);
        lVar17 = lVar17 + 1;
      } while (iVar1 != lVar17);
    }
    if (iVar18 == iVar1) goto LAB_002dbff4;
    pMVar9 = Abc_NtkMapCopyCiArrivalCon(pNtk);
  }
  Map_ManSetInputArrivals(p,pMVar9);
  iVar18 = 0;
  pSVar7 = Scl_ConReadMan();
  if (pSVar7 != (Scl_Con_t *)0x0) {
    pSVar7 = Scl_ConReadMan();
    iVar1 = (pSVar7->vOutReqs).nSize;
    if (0 < (long)iVar1) {
      lVar17 = 0;
      iVar18 = 0;
      do {
        iVar18 = iVar18 + (uint)((pSVar7->vOutReqs).pArray[lVar17] == 0);
        lVar17 = lVar17 + 1;
      } while (iVar1 != lVar17);
    }
    if (iVar18 != iVar1) {
      pMVar9 = Abc_NtkMapCopyCoRequiredCon(pNtk);
      goto LAB_002dc078;
    }
  }
  pAVar8 = Abc_NtkGetCoRequiredTimes(pNtk);
  pMVar9 = Abc_NtkMapCopyCoRequired(pNtk,pAVar8);
LAB_002dc078:
  Map_ManSetOutputRequireds(p,pMVar9);
  Abc_NtkCleanCopy(pNtk);
  pMVar10 = Map_ManReadConst1(p);
  pAVar11 = Abc_AigConst1(pNtk);
  (pAVar11->field_6).pCopy = (Abc_Obj_t *)pMVar10;
  pVVar13 = pNtk->vCis;
  uVar15 = (ulong)(uint)pVVar13->nSize;
  if (0 < pVVar13->nSize) {
    uVar19 = 0;
    do {
      if (uVar19 == (uint)((int)uVar15 - pNtk->nBarBufs)) break;
      pvVar3 = pVVar13->pArray[uVar19];
      ppMVar12 = Map_ManReadInputs(p);
      pMVar10 = ppMVar12[uVar19];
      *(Map_Node_t **)((long)pvVar3 + 0x40) = pMVar10;
      if (pSwitching != (float *)0x0) {
        Map_NodeSetSwitching(pMVar10,pSwitching[*(int *)((long)pvVar3 + 0x10)]);
      }
      uVar19 = uVar19 + 1;
      pVVar13 = pNtk->vCis;
      uVar15 = (ulong)pVVar13->nSize;
    } while ((long)uVar19 < (long)uVar15);
  }
  pVVar13 = Abc_AigDfsMap(pNtk);
  if (0 < pVVar13->nSize) {
    lVar17 = 0;
    do {
      plVar4 = (long *)pVVar13->pArray[lVar17];
      uVar2 = *(uint *)((long)plVar4 + 0x14);
      if ((uVar2 & 0xf) == 7) {
        lVar6 = *(long *)(*(long *)(*plVar4 + 0x20) + 8);
        pMVar10 = Map_NodeAnd(p,(Map_Node_t *)
                                ((ulong)(uVar2 >> 10 & 1) ^
                                *(ulong *)(*(long *)(lVar6 + (long)*(int *)plVar4[4] * 8) + 0x40)),
                              (Map_Node_t *)
                              ((ulong)(uVar2 >> 0xb & 1) ^
                              *(ulong *)(*(long *)(lVar6 + (long)((int *)plVar4[4])[1] * 8) + 0x40))
                             );
        if (plVar4[8] != 0) {
          __assert_fail("pNode->pCopy == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                        ,0x13e,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
        }
        plVar4[8] = (long)pMVar10;
        if (pSwitching != (float *)0x0) {
          Map_NodeSetSwitching(pMVar10,pSwitching[(int)plVar4[2]]);
        }
        if (((ulong)plVar4 & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_002dc32e:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,400,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
        }
        if (*(int *)*plVar4 != 3) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_002dc32e;
        }
        if (((long *)plVar4[7] != (long *)0x0) &&
           (plVar5 = (long *)plVar4[7], plVar16 = plVar4, 0 < *(int *)((long)plVar4 + 0x2c))) {
          do {
            plVar14 = plVar5;
            Map_NodeSetNextE((Map_Node_t *)plVar16[8],(Map_Node_t *)plVar14[8]);
            Map_NodeSetRepr((Map_Node_t *)plVar14[8],(Map_Node_t *)plVar4[8]);
            plVar5 = (long *)plVar14[7];
            plVar16 = plVar14;
          } while ((long *)plVar14[7] != (long *)0x0);
        }
      }
      else {
        if ((uVar2 & 0xf) != 8) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                        ,0x139,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
        }
        plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
        pMVar10 = Map_NodeBuf(p,(Map_Node_t *)
                                ((ulong)(*(uint *)((long)plVar5 + 0x14) >> 10 & 1) ^
                                *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                                    (long)*(int *)plVar5[4] * 8) + 0x40)));
        *(Map_Node_t **)
         (*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8) + 0x40)
             = pMVar10;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar13->nSize);
  }
  iVar18 = Map_ManReadBufNum(p);
  if (iVar18 != pNtk->nBarBufs) {
    __assert_fail("Map_ManReadBufNum(pMan) == pNtk->nBarBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMap.c"
                  ,0x14b,"Map_Man_t *Abc_NtkToMap(Abc_Ntk_t *, double, int, float *, int)");
  }
  if (pVVar13->pArray != (void **)0x0) {
    free(pVVar13->pArray);
  }
  free(pVVar13);
  pVVar13 = pNtk->vCos;
  uVar15 = (ulong)(uint)pVVar13->nSize;
  if (0 < pVVar13->nSize) {
    uVar19 = 0;
    do {
      if (uVar19 == (uint)((int)uVar15 - pNtk->nBarBufs)) {
        return p;
      }
      plVar4 = (long *)pVVar13->pArray[uVar19];
      uVar2 = *(uint *)((long)plVar4 + 0x14);
      uVar15 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                   (long)*(int *)plVar4[4] * 8) + 0x40);
      ppMVar12 = Map_ManReadOutputs(p);
      ppMVar12[uVar19] = (Map_Node_t *)(uVar2 >> 10 & 1 ^ uVar15);
      uVar19 = uVar19 + 1;
      pVVar13 = pNtk->vCos;
      uVar15 = (ulong)pVVar13->nSize;
    } while ((long)uVar19 < (long)uVar15);
  }
  return p;
}

Assistant:

Map_Man_t * Abc_NtkToMap( Abc_Ntk_t * pNtk, double DelayTarget, int fRecovery, float * pSwitching, int fVerbose )
{
    Map_Man_t * pMan;
    Map_Node_t * pNodeMap;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode, * pFanin, * pPrev;
    int i;

    assert( Abc_NtkIsStrash(pNtk) );

    // start the mapping manager and set its parameters
    pMan = Map_ManCreate( Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, Abc_NtkPoNum(pNtk) + Abc_NtkLatchNum(pNtk) - pNtk->nBarBufs, fVerbose );
    if ( pMan == NULL )
        return NULL;
    Map_ManSetAreaRecovery( pMan, fRecovery );
    Map_ManSetOutputNames( pMan, Abc_NtkCollectCioNames(pNtk, 1) );
    Map_ManSetDelayTarget( pMan, (float)DelayTarget );

    // set arrival and requireds
    if ( Scl_ConIsRunning() && Scl_ConHasInArrs() )
        Map_ManSetInputArrivals( pMan, Abc_NtkMapCopyCiArrivalCon(pNtk) );
    else
        Map_ManSetInputArrivals( pMan, Abc_NtkMapCopyCiArrival(pNtk, Abc_NtkGetCiArrivalTimes(pNtk)) );
    if ( Scl_ConIsRunning() && Scl_ConHasOutReqs() )
        Map_ManSetOutputRequireds( pMan, Abc_NtkMapCopyCoRequiredCon(pNtk) );
    else
        Map_ManSetOutputRequireds( pMan, Abc_NtkMapCopyCoRequired(pNtk, Abc_NtkGetCoRequiredTimes(pNtk)) );

    // create PIs and remember them in the old nodes
    Abc_NtkCleanCopy( pNtk );
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Map_ManReadConst1(pMan);
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCiNum(pNtk) - pNtk->nBarBufs )
            break;
        pNodeMap = Map_ManReadInputs(pMan)[i];
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
    }

    // load the AIG into the mapper
    vNodes = Abc_AigDfsMap( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsLatch(pNode) )
        {
            pFanin = Abc_ObjFanin0(pNode);
            pNodeMap = Map_NodeBuf( pMan, Map_NotCond( Abc_ObjFanin0(pFanin)->pCopy, (int)Abc_ObjFaninC0(pFanin) ) );
            Abc_ObjFanout0(pNode)->pCopy = (Abc_Obj_t *)pNodeMap;
            continue;
        }
        assert( Abc_ObjIsNode(pNode) );
        // add the node to the mapper
        pNodeMap = Map_NodeAnd( pMan, 
            Map_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) ),
            Map_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) ) );
        assert( pNode->pCopy == NULL );
        // remember the node
        pNode->pCopy = (Abc_Obj_t *)pNodeMap;
        if ( pSwitching )
            Map_NodeSetSwitching( pNodeMap, pSwitching[pNode->Id] );
        // set up the choice node
        if ( Abc_AigNodeIsChoice( pNode ) )
            for ( pPrev = pNode, pFanin = (Abc_Obj_t *)pNode->pData; pFanin; pPrev = pFanin, pFanin = (Abc_Obj_t *)pFanin->pData )
            {
                Map_NodeSetNextE( (Map_Node_t *)pPrev->pCopy, (Map_Node_t *)pFanin->pCopy );
                Map_NodeSetRepr( (Map_Node_t *)pFanin->pCopy, (Map_Node_t *)pNode->pCopy );
            }
    }
    assert( Map_ManReadBufNum(pMan) == pNtk->nBarBufs );
    Vec_PtrFree( vNodes );

    // set the primary outputs in the required phase
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i == Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Map_ManReadOutputs(pMan)[i] = Map_NotCond( (Map_Node_t *)Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
    }
    return pMan;
}